

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O2

bool __thiscall
UnifiedRegex::ChompSetBoundedInst::Exec
          (ChompSetBoundedInst *this,Matcher *matcher,Char *input,CharCount inputLength,
          CharCount *matchStart,CharCount *inputOffset,CharCount *nextSyncInputOffset,
          uint8 **instPointer,ContStack *contStack,AssertionStack *assertionStack,uint *qcTicks,
          bool firstIteration)

{
  uint64 *puVar1;
  uint uVar2;
  bool bVar3;
  uint uVar4;
  uint uVar5;
  
  uVar2 = *inputOffset;
  uVar4 = (this->super_ChompBoundedMixin).repeats.upper;
  uVar5 = uVar4 + uVar2;
  if (inputLength - uVar2 <= uVar4) {
    uVar5 = inputLength;
  }
  if (matcher->stats != (Type)0x0) {
    puVar1 = &matcher->stats->numCompares;
    *puVar1 = *puVar1 + 1;
  }
  uVar4 = uVar2;
  do {
    if (uVar5 <= uVar4) {
LAB_00d4ed64:
      if (uVar4 - uVar2 < (this->super_ChompBoundedMixin).repeats.lower) {
        bVar3 = Matcher::Fail(matcher,input,inputOffset,instPointer,contStack,assertionStack,qcTicks
                             );
      }
      else {
        *instPointer = *instPointer + 0x31;
        bVar3 = false;
      }
      return bVar3;
    }
    bVar3 = RuntimeCharSet<char16_t>::Get(&(this->super_SetMixin<false>).set,input[uVar4]);
    if (!bVar3) {
      uVar4 = *inputOffset;
      goto LAB_00d4ed64;
    }
    if (matcher->stats != (Type)0x0) {
      puVar1 = &matcher->stats->numCompares;
      *puVar1 = *puVar1 + 1;
    }
    uVar4 = *inputOffset + 1;
    *inputOffset = uVar4;
  } while( true );
}

Assistant:

inline bool ChompSetBoundedInst::Exec(REGEX_INST_EXEC_PARAMETERS) const
    {
        const RuntimeCharSet<Char>& matchSet = this->set;
        const CharCount loopMatchStart = inputOffset;
        const CharCountOrFlag repeatsUpper = repeats.upper;
        const CharCount inputEndOffset =
            static_cast<CharCount>(repeatsUpper) >= inputLength - inputOffset
                ? inputLength
                : inputOffset + static_cast<CharCount>(repeatsUpper);
#if ENABLE_REGEX_CONFIG_OPTIONS
        matcher.CompStats();
#endif
        while (inputOffset < inputEndOffset && matchSet.Get(input[inputOffset]))
        {
#if ENABLE_REGEX_CONFIG_OPTIONS
            matcher.CompStats();
#endif
            inputOffset++;
        }

        if (inputOffset - loopMatchStart < repeats.lower)
        {
            return matcher.Fail(FAIL_PARAMETERS);
        }

        instPointer += sizeof(*this);
        return false;
    }